

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timeout.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  uint uVar5;
  EVP_PKEY_CTX *in_RDI;
  uint uVar6;
  int len;
  FILE *local_440;
  char name [1024];
  
  init(in_RDI);
  local_440 = fopen("dnsrelay1.txt","r");
  if (local_440 == (FILE *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
            ,0x2e,"%s:%s","file open error:",pcVar4);
    *piVar3 = 0;
  }
  else {
    puts(&DAT_00103128);
    sleep(1000);
    uVar5 = 1;
    uVar6 = 0;
    while( true ) {
      iVar1 = __isoc99_fscanf(local_440,"%s",name);
      if (iVar1 != 1) break;
      printf("%d ===================== %s\n",(ulong)uVar5,name);
      iVar1 = write_dns_query(buffer,name,1);
      sVar2 = sendto(ss,buffer,(long)iVar1,0,(sockaddr *)&query_server,0x10);
      if (sVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
                ,0x47,"%s:%s","sendto error:",pcVar4);
        *piVar3 = 0;
      }
      len = 0x10;
      sVar2 = recvfrom(ss,buffer,0x208,0,(sockaddr *)&query_server,(socklen_t *)&len);
      if ((int)sVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/test/test_timeout.c"
                ,0x4b,"%s:%s","recvfrom error:",pcVar4);
        *piVar3 = 0;
      }
      read_dns_header(&header,buffer);
      if ((header.field_1.flags & 0xf00) != 0x500) {
        uVar6 = uVar6 + 1;
        printf("ERROR %d %s\n",(ulong)uVar6,name);
      }
      uVar5 = uVar5 + 1;
    }
    if (uVar6 == 0) {
      printf(anon_var_dwarf_150);
      system("pause");
      return 0;
    }
    printf("find %d wrong",(ulong)uVar6);
  }
  exit(1);
}

Assistant:

int main(){
    init();
     FILE *in;
    if( (in = fopen("dnsrelay1.txt","r"))==NULL){//fopen_s和fopen的接口不一样
        log_error_shortcut("file open error:");
        exit(EXIT_FAILURE);
    }
     printf("请确定自己离线中\n");
     #ifdef _WIN64
     Sleep(1000);
     #else
     sleep(1000);
     #endif
    char ip[1024];
    char name[1024];
	char result[10240];
  int error=0;
  int x=0;


    while(fscanf(in, "%s",name)==1){
        printf("%d ===================== %s\n",++x,name);
        struct question dns_question;
        strcpy( dns_question.label,name);
        dns_question.qclass= HTTP_CLASS;
        dns_question.qtype = RRTYPE_A;
        int total_size=write_dns_query(buffer,name,RRTYPE_A);
         if ( (sendto(ss, buffer, total_size, 0, (SA *)&(query_server),sizeof(query_server) )  ) < 0){
            // printf("%d\n",total_size);
          log_error_shortcut("sendto error:");
      }
      int len=sizeof(query_server) ;
      if (( (total_size = recvfrom(ss, buffer, MAX_DNS_SIZE, 0,(SA *)&query_server, &len))<0)){
          log_error_shortcut("recvfrom error:");
      }
      read_dns_header(&header,buffer);
      if(header.rcode!=5){
          printf("ERROR %d %s\n",++error,name);
      }
      
    }
    if(error){
    printf("find %d wrong",error);
    exit(EXIT_FAILURE);}
    else{
      printf("恭喜！\nおめでとうございます\nCongratulations!");
    }
    system("pause");
    return 0;
}